

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_size.c
# Opt level: O1

int kseq_read(kseq_t *seq)

{
  kstring_t *str;
  kstream_t *ks;
  size_t sVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  char *pcVar4;
  ulong uVar5;
  size_t __size;
  int c;
  undefined8 uStack_28;
  
  ks = seq->f;
  uStack_28 = in_RAX;
  if (seq->last_char == 0) {
    do {
      if ((ks->is_eof == 0) || (uVar3 = 0xffffffff, ks->begin < ks->end)) {
        if (ks->end <= ks->begin) {
          ks->begin = 0;
          iVar2 = gzread(ks->f,ks->buf,0xffff);
          ks->end = iVar2;
          if (iVar2 == 0) {
            ks->is_eof = 1;
            uVar3 = 0xffffffff;
            goto LAB_00104c22;
          }
        }
        iVar2 = ks->begin;
        ks->begin = iVar2 + 1;
        uVar3 = (uint)ks->buf[iVar2];
      }
LAB_00104c22:
      uStack_28 = CONCAT44(uVar3,(undefined4)uStack_28);
      if (uVar3 == 0xffffffff) {
        return -1;
      }
    } while ((uVar3 != 0x40) && (uVar3 != 0x3e));
    seq->last_char = uVar3;
  }
  (seq->qual).l = 0;
  (seq->seq).l = 0;
  (seq->comment).l = 0;
  iVar2 = ks_getuntil2(ks,0,&seq->name,(int *)((long)&uStack_28 + 4),0);
  if (iVar2 < 0) {
    iVar2 = -1;
  }
  else {
    if (uStack_28._4_4_ != 10) {
      ks_getuntil2(ks,2,&seq->comment,(int *)0x0,0);
    }
    if ((seq->seq).s == (char *)0x0) {
      (seq->seq).m = 0x100;
      pcVar4 = (char *)malloc(0x100);
      (seq->seq).s = pcVar4;
    }
    str = &seq->seq;
LAB_00104ca0:
    if ((ks->is_eof == 0) || (uVar3 = 0xffffffff, ks->begin < ks->end)) {
      if (ks->end <= ks->begin) {
        ks->begin = 0;
        iVar2 = gzread(ks->f,ks->buf,0xffff);
        ks->end = iVar2;
        if (iVar2 == 0) {
          ks->is_eof = 1;
          uVar3 = 0xffffffff;
          goto LAB_00104cf3;
        }
      }
      iVar2 = ks->begin;
      ks->begin = iVar2 + 1;
      uVar3 = (uint)ks->buf[iVar2];
    }
LAB_00104cf3:
    uStack_28 = CONCAT44(uVar3,(undefined4)uStack_28);
    if ((int)uVar3 < 0x2b) goto code_r0x00104cfc;
    if (uVar3 != 0x2b) {
      if ((uVar3 != 0x3e) && (uVar3 != 0x40)) goto LAB_00104d17;
      seq->last_char = uVar3;
    }
LAB_00104d63:
    uVar5 = (seq->seq).l + 1;
    if ((seq->seq).m <= uVar5) {
      uVar5 = uVar5 >> 1 | uVar5;
      uVar5 = uVar5 >> 2 | uVar5;
      uVar5 = uVar5 >> 4 | uVar5;
      uVar5 = uVar5 >> 8 | uVar5;
      __size = (uVar5 >> 0x10 | uVar5) + 1;
      (seq->seq).m = __size;
      pcVar4 = (char *)realloc((seq->seq).s,__size);
      (seq->seq).s = pcVar4;
    }
    (seq->seq).s[(seq->seq).l] = '\0';
    if (uStack_28._4_4_ == 0x2b) {
      uVar5 = (seq->seq).m;
      if ((seq->qual).m < uVar5) {
        (seq->qual).m = uVar5;
        pcVar4 = (char *)realloc((seq->qual).s,uVar5);
        (seq->qual).s = pcVar4;
      }
      do {
        if ((ks->is_eof == 0) || (uVar3 = 0xffffffff, ks->begin < ks->end)) {
          if (ks->end <= ks->begin) {
            ks->begin = 0;
            iVar2 = gzread(ks->f,ks->buf,0xffff);
            ks->end = iVar2;
            if (iVar2 == 0) {
              ks->is_eof = 1;
              uVar3 = 0xffffffff;
              goto LAB_00104e4b;
            }
          }
          iVar2 = ks->begin;
          ks->begin = iVar2 + 1;
          uVar3 = (uint)ks->buf[iVar2];
        }
LAB_00104e4b:
        uStack_28 = CONCAT44(uVar3,(undefined4)uStack_28);
        if (uVar3 == 0xffffffff) {
          return -2;
        }
      } while (uVar3 != 10);
      do {
        iVar2 = ks_getuntil2(ks,2,&seq->qual,(int *)0x0,1);
        if (iVar2 < 0) break;
      } while ((seq->qual).l < str->l);
      seq->last_char = 0;
      sVar1 = (seq->seq).l;
      iVar2 = -2;
      if (sVar1 == (seq->qual).l) {
        iVar2 = (int)sVar1;
      }
    }
    else {
      iVar2 = (int)str->l;
    }
  }
  return iVar2;
code_r0x00104cfc:
  if (uVar3 != 10) {
    if (uVar3 == 0xffffffff) goto LAB_00104d63;
LAB_00104d17:
    sVar1 = (seq->seq).l;
    (seq->seq).l = sVar1 + 1;
    (seq->seq).s[sVar1] = (char)uVar3;
    ks_getuntil2(ks,2,str,(int *)0x0,1);
  }
  goto LAB_00104ca0;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_size(char *input_file, int min, int max,int length, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int hit = 0;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

    if (verbose_flag) {
        if (is_fasta)
            fprintf(stderr, "Input is FASTA format\n");
        else
            fprintf(stderr, "Input is FASTQ format\n");
    }

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		hit = size_filter(seq, is_fasta, min, max, length, convert, just_count);
		if (hit)
			count++;
		else
			excluded++;
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}